

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void wasm::copy_file(string *input,string *output)

{
  undefined1 local_440 [8];
  ifstream src;
  streambuf local_430 [504];
  undefined1 local_238 [8];
  ofstream dst;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  ios_base local_140 [264];
  PathString local_38;
  
  Path::to_path((PathString *)local_238,input);
  std::ifstream::ifstream(local_440,(string *)local_238,_S_bin);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
  }
  Path::to_path(&local_38,output);
  std::ofstream::ofstream(local_238,(string *)&local_38,_S_bin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::ostream::operator<<(local_238,local_430);
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_238 + *(long *)(_VTT + -0x18)) = __M_insert<long>;
  std::filebuf::~filebuf((filebuf *)&dst);
  std::ios_base::~ios_base(local_140);
  std::ifstream::~ifstream(local_440);
  return;
}

Assistant:

void wasm::copy_file(std::string input, std::string output) {
  std::ifstream src(wasm::Path::to_path(input), std::ios::binary);
  std::ofstream dst(wasm::Path::to_path(output), std::ios::binary);
  dst << src.rdbuf();
}